

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnderwaterAcousticFundamentalParameterData.h
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::UnderwaterAcousticEmitterBeam::SetUnderwaterAcousticFundamentalParameterData
          (UnderwaterAcousticEmitterBeam *this,UnderwaterAcousticFundamentalParameterData *UAFPD)

{
  KUINT16 KVar1;
  KFLOAT32 KVar2;
  KFLOAT32 KVar3;
  KFLOAT32 KVar4;
  
  (this->m_UAFPD).m_f32DEBeamwidth = UAFPD->m_f32DEBeamwidth;
  KVar1 = UAFPD->m_ui16ScanPattern;
  KVar2 = UAFPD->m_f32BeamCenterAzimuth;
  KVar3 = UAFPD->m_f32AzimuthalBeamWidth;
  KVar4 = UAFPD->m_f32BeamCenterDE;
  (this->m_UAFPD).m_ui16AEPI = UAFPD->m_ui16AEPI;
  (this->m_UAFPD).m_ui16ScanPattern = KVar1;
  (this->m_UAFPD).m_f32BeamCenterAzimuth = KVar2;
  (this->m_UAFPD).m_f32AzimuthalBeamWidth = KVar3;
  (this->m_UAFPD).m_f32BeamCenterDE = KVar4;
  return;
}

Assistant:

class KDIS_EXPORT UnderwaterAcousticFundamentalParameterData : public DataTypeBase
{
protected:

    KUINT16 m_ui16AEPI;

    KUINT16 m_ui16ScanPattern;

    KFLOAT32 m_f32BeamCenterAzimuth;

    KFLOAT32 m_f32AzimuthalBeamWidth;

    KFLOAT32 m_f32BeamCenterDE;

    KFLOAT32 m_f32DEBeamwidth;

public:

    static const KUINT16 UNDERWATER_ACOUSTIC_FUNDAMENTAL_PARAMETER_SIZE_SIZE = 20;

    UnderwaterAcousticFundamentalParameterData();

    UnderwaterAcousticFundamentalParameterData(KDataStream &stream) noexcept(false);

    UnderwaterAcousticFundamentalParameterData( KDIS::DATA_TYPE::ENUMS::ActiveEmissionParameterIndex AEPI, KDIS::DATA_TYPE::ENUMS::ScanPattern SP, 
		                                        KFLOAT32 BeamCenterAzimuth, KFLOAT32 AzimuthalBeamwidth, KFLOAT32 BeamCenter, KFLOAT32 BeamWidth );

    virtual ~UnderwaterAcousticFundamentalParameterData();

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::SetActiveEmissionParameterIndex
    //              KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::GetActiveEmissionParameterIndex
    // Description: Indicates which database record shall be used in the definition of
    //              intentional emissions of the entity.
    // Parameter:   ActiveEmissionParameterIndex AEPI
    //************************************
    void SetActiveEmissionParameterIndex( KDIS::DATA_TYPE::ENUMS::ActiveEmissionParameterIndex AEPI );
    KDIS::DATA_TYPE::ENUMS::ActiveEmissionParameterIndex GetActiveEmissionParameterIndex() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::SetScanPattern
    //              KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::GetScanPattern
    // Description: Desscribes the UA scan pattern.
    // Parameter:   ScanPattern SP
    //************************************
    void SetScanPattern( KDIS::DATA_TYPE::ENUMS::ScanPattern SP );
    KDIS::DATA_TYPE::ENUMS::ScanPattern GetScanPattern() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::SetBeamCenterAzimuth
    //              KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::GetBeamCenterAzimuth
    // Description: Beam center azimuth(Horizontal bearing). Specifies the center azimuthal bearing of the main
    //              beam(as opposed to sidelobes) in relation to the emitter coordinate system.
    //              The azimuth center for 360 degrees bearing shall be 0. Omnidirectional beams shall have
    //              the value 0.
    //              Represented as radians.
    // Parameter:   KFLOAT32 BCA
    //************************************
    void SetBeamCenterAzimuth( KFLOAT32 BCA );
    KFLOAT32 GetBeamCenterAzimuth() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::SetAzimuthalBeamwidth
    //              KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::GetAzimuthalBeamWidth
    // Description: Azimuthal beam width(Horizontal beamwidth). Beamwidth shall be measured
    //              at the 3db down point of peak radiated power. Omnidirectional beams shall have
    //              the value 0.
    //              Represented as radians.
    // Parameter:   KFLOAT32 AB
    //************************************
    void SetAzimuthalBeamwidth( KFLOAT32 AB );
    KFLOAT32 GetAzimuthalBeamWidth() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::SetBeamCenter
    //              KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::GetBeamCenter
    // Description: Beam center Depression/Elevation (D/E). Specifies the center of the
    //              D/E angle of the main beam relative to the stabilized D/E angle of the target(I.E
    //              assume the target is stabilized and parrallel to the earth for determining the D/E angle).
    //              Represented as radians.
    //              A depression angle shall be defines as a downward angle and assigned a negative value.
    //              An elevation shall be defined as an upward angle and assigned a positive value.
    //              Omnidirectional beams shall have the value 0.
    // Parameter:   KFLOAT32 BC
    //************************************
    void SetBeamCenter( KFLOAT32 BC );
    KFLOAT32 GetBeamCenter() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::SetBeamWidth
    //              KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::GetBeamWidth
    // Description: Depression/Elevation (D/E) Beamwidth(Vertical Beamwidth).
    //              Beamwidth shall be measured at the 3db point of the peak radiated power.
    //              Represented as radians.
    //              Omnidirectional beams shall have the value 0.
    // Parameter:   KFLOAT32 BC
    //************************************
    void SetBeamWidth( KFLOAT32 BW );
    KFLOAT32 GetBeamWidth() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::GetAsString
    // Description: Returns a string representation
    //************************************
    virtual KString GetAsString() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual void Decode(KDataStream &stream) noexcept(false);

    //************************************
    // FullName:    KDIS::DATA_TYPE::UnderwaterAcousticFundamentalParameterData::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    virtual KDataStream Encode() const;
    virtual void Encode( KDataStream & stream ) const;

    KBOOL operator == ( const UnderwaterAcousticFundamentalParameterData & Value ) const;
    KBOOL operator != ( const UnderwaterAcousticFundamentalParameterData & Value ) const;
}